

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_relax_snode.c
# Opt level: O1

void heap_relax_snode(int n,int *et,int relax_columns,int *descendants,int *relax_end)

{
  int iVar1;
  int_t *addr;
  int *addr_00;
  int iVar2;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  char msg [256];
  char local_138 [264];
  int iVar3;
  
  addr = intMalloc(n * 3 + 2);
  if (addr == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for iwork[]",0x43,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/heap_relax_snode.c"
           );
    superlu_abort_and_exit(local_138);
  }
  lVar4 = (long)n;
  addr_00 = TreePostorder(n,et);
  if (-1 < n) {
    uVar5 = 0;
    do {
      addr[lVar4 + (long)addr_00[uVar5] + 1] = (int_t)uVar5;
      uVar5 = uVar5 + 1;
    } while (n + 1 != uVar5);
  }
  uVar5 = (ulong)(uint)n;
  if (0 < n) {
    uVar7 = 0;
    do {
      addr[addr_00[uVar7]] = addr_00[et[uVar7]];
      addr[lVar4 * 2 + uVar7 + 2] = et[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  if (0 < n) {
    uVar7 = 0;
    do {
      et[uVar7] = addr[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  ifill(relax_end,n,-1);
  if (0 < n) {
    memset(descendants,0,uVar5 * 4);
    uVar7 = 0;
    do {
      iVar2 = et[uVar7];
      if (iVar2 != n) {
        descendants[iVar2] = descendants[uVar7] + descendants[iVar2] + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  if (0 < n) {
    iVar2 = 0;
    do {
      lVar6 = (long)iVar2;
      iVar8 = et[lVar6];
      iVar3 = iVar2;
      while ((iVar1 = iVar8, iVar1 != n && (descendants[iVar1] < relax_columns))) {
        iVar3 = iVar1;
        iVar8 = et[iVar1];
      }
      iVar8 = n;
      if (iVar2 <= iVar3) {
        lVar10 = 0;
        do {
          if (addr[lVar4 + lVar6 + lVar10 + 1] <= iVar8) {
            iVar8 = addr[lVar4 + lVar6 + lVar10 + 1];
          }
          lVar10 = lVar10 + 1;
        } while ((iVar3 - iVar2) + 1 != (int)lVar10);
      }
      lVar10 = (long)iVar3;
      if (addr[lVar4 + lVar10 + 1] - iVar8 == iVar3 - iVar2) {
        relax_end[iVar8] = addr[lVar4 + lVar10 + 1];
      }
      else if (iVar2 <= iVar3) {
        lVar9 = 0;
        do {
          if (descendants[lVar6 + lVar9] == 0) {
            relax_end[addr[lVar4 + lVar6 + lVar9 + 1]] = addr[lVar4 + lVar6 + lVar9 + 1];
          }
          lVar9 = lVar9 + 1;
        } while ((iVar3 - iVar2) + 1 != (int)lVar9);
      }
      do {
        lVar10 = lVar10 + 1;
        iVar2 = iVar3 + 1;
        if (descendants[lVar10] == 0) break;
        iVar3 = iVar2;
      } while (lVar10 < (long)uVar5);
    } while (iVar2 < n);
  }
  if (0 < n) {
    uVar7 = 0;
    do {
      et[uVar7] = addr[lVar4 * 2 + uVar7 + 2];
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  superlu_free(addr_00);
  superlu_free(addr);
  return;
}

Assistant:

void
heap_relax_snode (
	     const     int n,
	     int       *et,           /* column elimination tree */
	     const int relax_columns, /* max no of columns allowed in a
					 relaxed snode */
	     int       *descendants,  /* no of descendants of each node
					 in the etree */
	     int       *relax_end     /* last column in a supernode */
	     )
{
    register int i, j, k, l, parent;
    register int snode_start;	/* beginning of a snode */
    int *et_save, *post, *inv_post, *iwork;
#if ( PRNTlevel>=1 )
    int nsuper_et = 0, nsuper_et_post = 0;
#endif

    /* The etree may not be postordered, but is heap ordered. */

    iwork = (int*) intMalloc(3*n+2); 
    if ( !iwork ) ABORT("SUPERLU_MALLOC fails for iwork[]");
    inv_post = iwork + n+1;
    et_save = inv_post + n+1;

    /* Post order etree */
    post = (int *) TreePostorder(n, et);
    for (i = 0; i < n+1; ++i) inv_post[post[i]] = i;

    /* Renumber etree in postorder */
    for (i = 0; i < n; ++i) {
        iwork[post[i]] = post[et[i]];
	et_save[i] = et[i]; /* Save the original etree */
    }
    for (i = 0; i < n; ++i) et[i] = iwork[i];

    /* Compute the number of descendants of each node in the etree */
    ifill (relax_end, n, SLU_EMPTY);
    for (j = 0; j < n; j++) descendants[j] = 0;
    for (j = 0; j < n; j++) {
	parent = et[j];
	if ( parent != n )  /* not the dummy root */
	    descendants[parent] += descendants[j] + 1;
    }

    /* Identify the relaxed supernodes by postorder traversal of the etree. */
    for (j = 0; j < n; ) { 
     	parent = et[j];
        snode_start = j;
 	while ( parent != n && descendants[parent] < relax_columns ) {
	    j = parent;
	    parent = et[j];
	}
	/* Found a supernode in postordered etree; j is the last column. */
#if ( PRNTlevel>=1 )
	++nsuper_et_post;
#endif
	k = n;
	for (i = snode_start; i <= j; ++i)
	    k = SUPERLU_MIN(k, inv_post[i]);
	l = inv_post[j];
	if ( (l - k) == (j - snode_start) ) {
	    /* It's also a supernode in the original etree */
	    relax_end[k] = l;		/* Last column is recorded */
#if ( PRNTlevel>=1 )
	    ++nsuper_et;
#endif
	} else {
	    for (i = snode_start; i <= j; ++i) {
	        l = inv_post[i];
	        if ( descendants[i] == 0 ) {
		    relax_end[l] = l;
#if ( PRNTlevel>=1 )
		    ++nsuper_et;
#endif
		}
	    }
	}
	j++;
	/* Search for a new leaf */
	while ( descendants[j] != 0 && j < n ) j++;
    }

#if ( PRNTlevel>=1 )
    printf(".. heap_snode_relax:\n"
	   "\tNo of relaxed snodes in postordered etree:\t%d\n"
	   "\tNo of relaxed snodes in original etree:\t%d\n",
	   nsuper_et_post, nsuper_et);
#endif

    /* Recover the original etree */
    for (i = 0; i < n; ++i) et[i] = et_save[i];

    SUPERLU_FREE(post);
    SUPERLU_FREE(iwork);
}